

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_add_order *m)

{
  uint64_t id;
  order_book *this_00;
  bool bVar1;
  side_type side_00;
  pointer ppVar2;
  uint64_t uVar3;
  ulong quantity_00;
  uint64_t timestamp;
  long in_RSI;
  nordic_itch_handler *in_RDI;
  order o;
  side_type side;
  uint32_t quantity;
  uint64_t price;
  uint64_t order_id;
  order_book *ob;
  iterator it;
  uint64_t order_book_id;
  unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
  *in_stack_fffffffffffffe58;
  order_book *in_stack_fffffffffffffef0;
  order in_stack_ffffffffffffff00;
  pair<const_unsigned_long,_helix::order_book_&> local_b8;
  event *local_a8;
  function<void_(const_helix::event_&)> *pfStack_a0;
  order_book *local_98;
  unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
  *puStack_90;
  string *local_88;
  uint64_t uStack_80;
  undefined1 local_78 [40];
  uint64_t uStack_50;
  side_type local_45;
  uint local_44;
  uint64_t local_40;
  uint64_t local_38;
  order_book *local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_20;
  uint64_t local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_18 = itch_uatoi((char *)(in_RSI + 0x14),6);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::find(in_stack_fffffffffffffe58,(key_type *)0x14edfe);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::end(in_stack_fffffffffffffe58);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>
                         *)0x14ee4a);
    local_30 = &ppVar2->second;
    local_38 = itch_uatoi((char *)(local_10 + 1),9);
    local_40 = itch_uatoi((char *)(local_10 + 0x1a),10);
    uVar3 = itch_uatoi((char *)(local_10 + 0xb),9);
    local_44 = (uint)uVar3;
    side_00 = itch_side((char)((ulong)in_RDI >> 0x30));
    id = local_38;
    uVar3 = local_40;
    quantity_00 = (ulong)local_44;
    local_45 = side_00;
    timestamp = nordic_itch_handler::timestamp(in_RDI);
    order::order((order *)local_78,id,uVar3,quantity_00,side_00,timestamp);
    local_88 = (string *)local_78._32_8_;
    uStack_80 = uStack_50;
    local_98 = (order_book *)local_78._16_8_;
    puStack_90 = (unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
                  *)local_78._24_8_;
    local_a8 = (event *)local_78._0_8_;
    pfStack_a0 = (function<void_(const_helix::event_&)> *)local_78._8_8_;
    order_book::add(in_stack_fffffffffffffef0,in_stack_ffffffffffffff00);
    std::pair<const_unsigned_long,_helix::order_book_&>::pair<unsigned_long_&,_true>
              (&local_b8,&local_38,local_30);
    std::
    unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
    ::insert((unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
              *)local_78._24_8_,(value_type *)local_78._16_8_);
    this_00 = local_30;
    uVar3 = nordic_itch_handler::timestamp(in_RDI);
    order_book::set_timestamp(this_00,uVar3);
    order_book::symbol_abi_cxx11_(local_30);
    nordic_itch_handler::timestamp(in_RDI);
    make_ob_event((string *)local_78._32_8_,local_78._24_8_,(order_book *)local_78._16_8_,
                  (event_mask)((ulong)local_78._8_8_ >> 0x20));
    std::function<void_(const_helix::event_&)>::operator()
              ((function<void_(const_helix::event_&)> *)local_78._8_8_,(event *)local_78._0_8_);
    event::~event((event *)0x14f082);
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_add_order* m)
{
    auto order_book_id = itch_uatoi(m->OrderBook, sizeof(m->OrderBook));
    auto it = order_book_id_map.find(order_book_id);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;

        uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
        uint64_t price    = itch_uatoi(m->Price, sizeof(m->Price));;
        uint32_t quantity = itch_uatoi(m->Quantity, sizeof(m->Quantity));;
        auto     side     = itch_side(m->BuySellIndicator);

        order o{order_id, price, quantity, side, timestamp()};
        ob.add(std::move(o));

        order_id_map.insert({order_id, ob});
        ob.set_timestamp(timestamp());
        _process_event(make_ob_event(ob.symbol(), timestamp(), &ob));
    }
}